

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

char * get_str(char *str,char **name_p)

{
  ulong uVar1;
  long lVar2;
  char *ptr;
  ulong uVar3;
  
  ptr = (char *)INT_CMmalloc(1);
  if (*str == '\"') {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      ptr = (char *)INT_CMrealloc(ptr,uVar3 + 2);
      uVar1 = uVar3 + 1;
      ptr[uVar3] = str[uVar3];
      lVar2 = uVar3 + 1;
      uVar3 = uVar1;
    } while (str[lVar2] != '\"');
    uVar3 = uVar1 & 0xffffffff;
    str = str + uVar1;
  }
  ptr[uVar3] = '\0';
  *name_p = ptr;
  return str + 1;
}

Assistant:

static char *
get_str(char *str, const char **name_p)
{
    int name_len = 0;
    char *name = malloc(1);
    while (*str != '"') {
	name = realloc(name, (name_len + 2));
	name[name_len++] = *(str++);
    }
    name[name_len] = 0;
    str++;
    *name_p = name;
    return str;
}